

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QUnifiedTimer::startAnimationDriver(QUnifiedTimer *this)

{
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  char *pcVar4;
  QUnifiedTimer *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = in_RDI;
  bVar2 = QAnimationDriver::isRunning((QAnimationDriver *)0x6689bd);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
               (int)((ulong)pcVar4 >> 0x20),in_RDI);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd8,
               "QUnifiedTimer::startAnimationDriver: driver is already running...");
  }
  else {
    qVar3 = elapsed(in_stack_ffffffffffffffd8);
    *(qint64 *)(in_RDI + 0xc0) = qVar3;
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x70))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::startAnimationDriver()
{
    if (driver->isRunning()) {
        qWarning("QUnifiedTimer::startAnimationDriver: driver is already running...");
        return;
    }
    // Set the start time to the currently elapsed() value before starting.
    // This means we get the animation system time including the temporal drift
    // which is what we want.
    driverStartTime = elapsed();
    driver->start();
}